

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

void w128_to_bitstream(bitstream_t *bs,word128 *v,size_t width,size_t size)

{
  ulong in_RCX;
  long in_RDX;
  uint64_t *in_RSI;
  bitstream_t *in_RDI;
  size_t bits;
  uint64_t *d;
  uint64_t buf [4];
  ulong local_88;
  uint64_t *local_80;
  uint64_t local_78 [7];
  bitstream_t *local_40;
  uint64_t local_38;
  uint64_t uStack_30;
  uint64_t *local_20;
  uint64_t local_18;
  uint64_t uStack_10;
  uint64_t *local_8;
  
  local_8 = local_78;
  local_18 = *in_RSI;
  uStack_10 = in_RSI[1];
  local_78[0] = local_18;
  local_78[1] = uStack_10;
  local_20 = local_78 + 2;
  local_38 = in_RSI[2];
  uStack_30 = in_RSI[3];
  local_78[2] = local_38;
  local_78[3] = uStack_30;
  local_80 = local_78 + in_RDX + -1;
  local_40 = in_RDI;
  for (local_88 = in_RCX; 0x3f < local_88; local_88 = local_88 - 0x40) {
    bitstream_put_bits(local_40,*local_80,0x40);
    local_80 = local_80 + -1;
  }
  if (local_88 != 0) {
    bitstream_put_bits(local_40,*local_80 >> (0x40U - (char)local_88 & 0x3f),(uint)local_88);
  }
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void w128_to_bitstream(bitstream_t* bs, const word128 v[2], const size_t width,
                                     const size_t size) {
  ATTR_ALIGNED(16) uint64_t buf[4];
  mm128_store(&buf[0], v[0]);
  mm128_store(&buf[2], v[1]);

  const uint64_t* d = &buf[width - 1];
  size_t bits       = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    bitstream_put_bits(bs, *d, sizeof(uint64_t) * 8);
  }
  if (bits) {
    bitstream_put_bits(bs, *d >> (sizeof(uint64_t) * 8 - bits), bits);
  }
}